

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_diag(ggml_context *ctx,ggml_tensor *a)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int64_t ne [4];
  int in_stack_ffffffffffffffb8;
  ggml_type in_stack_ffffffffffffffbc;
  ggml_context *in_stack_ffffffffffffffc0;
  
  if (in_RSI->ne[1] != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0xd2b
               ,"GGML_ASSERT(%s) failed","a->ne[1] == 1");
  }
  pgVar1 = ggml_new_tensor(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                           in_stack_ffffffffffffffb8,(int64_t *)0x14ea9e);
  pgVar1->op = GGML_OP_DIAG;
  pgVar1->src[0] = in_RSI;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_diag(
        struct ggml_context * ctx,
        struct ggml_tensor  * a) {
    GGML_ASSERT(a->ne[1] == 1);

    const int64_t ne[4] = { a->ne[0], a->ne[0], a->ne[2], a->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, a->type, 4, ne);

    result->op     = GGML_OP_DIAG;
    result->src[0] = a;

    return result;
}